

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcoflow.c
# Opt level: O3

DLword gc_handleoverflow(DLword arg)

{
  ushort uVar1;
  uint uVar2;
  uint *puVar3;
  DLword *pDVar4;
  uint uVar5;
  
  uVar2 = *HToverflow;
  puVar3 = HToverflow;
  pDVar4 = DTDspace;
  while (uVar5 = uVar2 & 0xfffffff, DTDspace = pDVar4, uVar5 != 0) {
    if ((-1 < *(short *)((ulong)(uVar5 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2)) &&
       (*GcDisabled_word != 0x4c)) {
      rec_htfind(uVar5,uVar2 >> 0x1c);
    }
    *puVar3 = 0;
    uVar2 = puVar3[1];
    puVar3 = puVar3 + 1;
    pDVar4 = DTDspace;
  }
  uVar1 = pDVar4[0x5d];
  if (0x400 < uVar1) {
    uVar2 = *Reclaim_cnt_word;
    if (uVar2 != 0) {
      uVar5 = uVar2 - uVar1;
      if (uVar2 < uVar1 || uVar5 == 0) {
        *Reclaim_cnt_word = 0;
        doreclaim();
      }
      else {
        *Reclaim_cnt_word = uVar5;
      }
    }
    *(uint *)(pDVar4 + 0x66) = *(int *)(pDVar4 + 0x66) + (uint)uVar1;
    pDVar4[0x5d] = 0;
  }
  return arg;
}

Assistant:

DLword gc_handleoverflow(DLword arg) {
  struct htoverflow *cell;
  struct dtd *ptr;
  LispPTR cellcnt;
  LispPTR addr;
  cell = (struct htoverflow *)HToverflow;
  /* This proc. protected from interrupt */
  while ((addr = cell->ptr) != NIL) {
    REC_GCLOOKUP(addr, cell->pcase);
    cell->ptr = 0;
    cell->pcase = 0;
    ++cell; /* (\ADDBASE CELL WORDSPERCELL) */
  }
  ptr = (struct dtd *)GetDTD(TYPE_LISTP);
  /* same as "extern struct dtd *ListpDTD" */
  if ((cellcnt = ptr->dtd_cnt0) > 1024) {
    Increment_Allocation_Count(cellcnt);
    ptr->dtd_oldcnt += cellcnt;
    ptr->dtd_cnt0 = 0;
  }
  return (arg);
}